

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsMuxer.cpp
# Opt level: O3

void __thiscall TSMuxer::parseMuxOpt(TSMuxer *this,string *opts)

{
  char cVar1;
  size_type sVar2;
  pointer pcVar3;
  int iVar4;
  int32_t iVar5;
  int64_t iVar6;
  long lVar7;
  size_type sVar8;
  pointer value;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  double dVar10;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  paramPair;
  string postfix;
  string prefix;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  params;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b0;
  string local_98;
  string local_78;
  double local_58;
  TSMuxer *local_50;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  splitStr_abi_cxx11_(&local_48,(opts->_M_dataplus)._M_p,' ');
  if (local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    value = local_48.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
    do {
      paVar9 = &local_98.field_2;
      trimStr(&local_98,value);
      splitStr_abi_cxx11_(&local_b0,local_98._M_dataplus._M_p,'=');
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != paVar9) {
        operator_delete(local_98._M_dataplus._M_p,
                        CONCAT71(local_98.field_2._M_allocated_capacity._1_7_,
                                 local_98.field_2._M_local_buf[0]) + 1);
      }
      if (local_b0.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_b0.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        iVar4 = std::__cxx11::string::compare
                          ((char *)local_b0.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start);
        if (iVar4 == 0) {
          this->m_pcrOnVideo = false;
        }
        else {
          iVar4 = std::__cxx11::string::compare
                            ((char *)local_b0.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start);
          if (iVar4 == 0) {
            this->m_useNewStyleAudioPES = true;
          }
          else {
            iVar4 = std::__cxx11::string::compare
                              ((char *)local_b0.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start);
            if (iVar4 == 0) {
              this->m_hdmvDescriptors = false;
            }
            else {
              iVar4 = std::__cxx11::string::compare
                                ((char *)local_b0.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start);
              if ((iVar4 == 0) &&
                 (0x20 < (ulong)((long)local_b0.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)local_b0.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start))) {
                dVar10 = strToDouble(local_b0.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p);
                this->m_cbrBitrate = (int)(dVar10 * 1000.0);
                dVar10 = strToDouble(local_b0.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p);
LAB_001dae6a:
                this->m_minBitrate = (int)(dVar10 * 1000.0);
              }
              else {
                iVar4 = std::__cxx11::string::compare
                                  ((char *)local_b0.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start);
                if ((iVar4 == 0) &&
                   (0x20 < (ulong)((long)local_b0.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_b0.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start))) {
                  dVar10 = strToDouble(local_b0.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p
                                      );
                  this->m_cbrBitrate = (int)(dVar10 * 1000.0);
                }
                else {
                  iVar4 = std::__cxx11::string::compare
                                    ((char *)local_b0.
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start);
                  if ((iVar4 == 0) &&
                     (0x20 < (ulong)((long)local_b0.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)local_b0.
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start))) {
                    dVar10 = strToDouble(local_b0.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus.
                                         _M_p);
                    goto LAB_001dae6a;
                  }
                  iVar4 = std::__cxx11::string::compare
                                    ((char *)local_b0.
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start);
                  if ((iVar4 == 0) &&
                     (0x20 < (ulong)((long)local_b0.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)local_b0.
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start))) {
                    iVar5 = strToInt32(local_b0.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p
                                      );
                    this->m_vbvLen = (long)iVar5 * 0x5a;
                    lVar7 = this->m_timeOffset + (long)iVar5 * -0x5a;
                    if (lVar7 < 1) {
                      lVar7 = 0;
                    }
                    this->m_fixed_pcr_offset = lVar7;
                    this->m_prevM2TSPCR = lVar7 * 300;
                  }
                  else {
                    iVar4 = std::__cxx11::string::compare
                                      ((char *)local_b0.
                                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start);
                    if (iVar4 == 0) {
                      iVar6 = strToInt64(local_b0.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus.
                                         _M_p);
                      this->m_splitDuration = iVar6 * 0x13b6d8300;
LAB_001dafab:
                      this->m_computeMuxStats = true;
                    }
                    else {
                      iVar4 = std::__cxx11::string::compare
                                        ((char *)local_b0.
                                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_start);
                      if (iVar4 == 0) {
                        local_98._M_string_length = 0;
                        local_98.field_2._M_local_buf[0] = '\0';
                        sVar2 = local_b0.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[1]._M_string_length;
                        local_98._M_dataplus._M_p = (pointer)paVar9;
                        local_50 = this;
                        if (sVar2 != 0) {
                          pcVar3 = local_b0.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p;
                          sVar8 = 0;
                          do {
                            cVar1 = pcVar3[sVar8];
                            if (cVar1 != '.' && 9 < (byte)(cVar1 - 0x30U)) {
                              std::__cxx11::string::push_back((char)&local_98);
                            }
                            sVar8 = sVar8 + 1;
                          } while (sVar2 != sVar8);
                        }
                        strToUpperCase(&local_78,&local_98);
                        std::__cxx11::string::operator=((string *)&local_98,(string *)&local_78);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_78._M_dataplus._M_p != &local_78.field_2) {
                          operator_delete(local_78._M_dataplus._M_p,
                                          local_78.field_2._M_allocated_capacity + 1);
                        }
                        iVar4 = std::__cxx11::string::compare((char *)&local_98);
                        this = local_50;
                        dVar10 = 1000000000.0;
                        if (iVar4 != 0) {
                          iVar4 = std::__cxx11::string::compare((char *)&local_98);
                          dVar10 = 1073741824.0;
                          if (iVar4 != 0) {
                            iVar4 = std::__cxx11::string::compare((char *)&local_98);
                            dVar10 = 1000000.0;
                            if (iVar4 != 0) {
                              iVar4 = std::__cxx11::string::compare((char *)&local_98);
                              dVar10 = 1048576.0;
                              if (iVar4 != 0) {
                                iVar4 = std::__cxx11::string::compare((char *)&local_98);
                                dVar10 = 1000.0;
                                if (iVar4 != 0) {
                                  iVar4 = std::__cxx11::string::compare((char *)&local_98);
                                  dVar10 = 1.0;
                                  if (iVar4 == 0) {
                                    dVar10 = 1024.0;
                                  }
                                }
                              }
                            }
                          }
                        }
                        local_58 = dVar10;
                        std::__cxx11::string::substr
                                  ((ulong)&local_78,
                                   (ulong)(local_b0.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start + 1));
                        dVar10 = strToDouble(local_78._M_dataplus._M_p);
                        this->m_splitSize = (uint32_t)(long)(local_58 * dVar10);
                        this->m_computeMuxStats = true;
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_78._M_dataplus._M_p != &local_78.field_2) {
                          operator_delete(local_78._M_dataplus._M_p,
                                          local_78.field_2._M_allocated_capacity + 1);
                        }
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_98._M_dataplus._M_p != &local_98.field_2) {
                          operator_delete(local_98._M_dataplus._M_p,
                                          CONCAT71(local_98.field_2._M_allocated_capacity._1_7_,
                                                   local_98.field_2._M_local_buf[0]) + 1);
                        }
                      }
                      else {
                        iVar4 = std::__cxx11::string::compare
                                          ((char *)local_b0.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                        if (((iVar4 == 0) ||
                            (iVar4 = std::__cxx11::string::compare
                                               ((char *)local_b0.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start),
                            iVar4 == 0)) ||
                           (iVar4 = std::__cxx11::string::compare
                                              ((char *)local_b0.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start),
                           iVar4 == 0)) {
                          this->m_bluRayMode = true;
                          this->m_computeMuxStats = true;
                        }
                        else {
                          iVar4 = std::__cxx11::string::compare
                                            ((char *)local_b0.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                          if ((iVar4 == 0) ||
                             (iVar4 = std::__cxx11::string::compare
                                                ((char *)local_b0.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start),
                             iVar4 == 0)) goto LAB_001dafab;
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_b0);
      value = value + 1;
    } while (value != local_48.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_48);
  return;
}

Assistant:

void TSMuxer::parseMuxOpt(const std::string& opts)
{
    const vector<string> params = splitStr(opts.c_str(), ' ');
    for (auto& i : params)
    {
        vector<string> paramPair = splitStr(trimStr(i).c_str(), '=');
        if (paramPair.empty())
            continue;
        if (paramPair[0] == "--no-pcr-on-video-pid")
            setPCROnVideoPID(false);
        else if (paramPair[0] == "--new-audio-pes")
            setNewStyleAudioPES(true);
        else if (paramPair[0] == "--no-hdmv-descriptors")
            m_hdmvDescriptors = false;
        else if (paramPair[0] == "--bitrate" && paramPair.size() > 1)
        {
            setMaxBitrate(static_cast<int>(strToDouble(paramPair[1].c_str()) * 1000.0));
            setMinBitrate(static_cast<int>(strToDouble(paramPair[1].c_str()) * 1000.0));
        }
        else if (paramPair[0] == "--maxbitrate" && paramPair.size() > 1)
            setMaxBitrate(static_cast<int>(strToDouble(paramPair[1].c_str()) * 1000.0));
        else if (paramPair[0] == "--minbitrate" && paramPair.size() > 1)
            setMinBitrate(static_cast<int>(strToDouble(paramPair[1].c_str()) * 1000.0));
        else if (paramPair[0] == "--vbv-len" && paramPair.size() > 1)
            setVBVBufferLen(strToInt32(paramPair[1].c_str()));
        else if (paramPair[0] == "--split-duration")
        {
            setSplitDuration(strToInt64(paramPair[1].c_str()) * INTERNAL_PTS_FREQ);
            m_computeMuxStats = true;
        }
        else if (paramPair[0] == "--split-size")
        {
            int64_t coeff = 1;
            string postfix;
            for (const auto& j : paramPair[1])
                if (!((j >= '0' && j <= '9') || j == '.'))
                    postfix += j;
            postfix = strToUpperCase(postfix);
            if (postfix == "GB")
                coeff = 1000LL * 1000 * 1000;
            else if (postfix == "GIB")
                coeff = 1024LL * 1024 * 1024;
            else if (postfix == "MB")
                coeff = 1000LL * 1000;
            else if (postfix == "MIB")
                coeff = 1024LL * 1024;
            else if (postfix == "KB")
                coeff = 1000;
            else if (postfix == "KIB")
                coeff = 1024;
            string prefix = paramPair[1].substr(0, paramPair[1].size() - postfix.size());
            setSplitSize(static_cast<uint32_t>(strToDouble(prefix.c_str()) * static_cast<double>(coeff)));
            m_computeMuxStats = true;
        }
        else if (paramPair[0] == "--blu-ray" || paramPair[0] == "--blu-ray-v3" || paramPair[0] == "--avchd")
        {
            m_bluRayMode = true;
            m_computeMuxStats = true;
        }
        else if (paramPair[0] == "--cut-start" || paramPair[0] == "--cut-end")
        {
            m_computeMuxStats = true;
        }
    }
}